

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeFinalize(Vdbe *p)

{
  long in_RDI;
  int rc;
  uint in_stack_fffffffffffffff0;
  int iVar1;
  
  iVar1 = 0;
  if (*(char *)(in_RDI + 199) != '\0') {
    iVar1 = sqlite3VdbeReset((Vdbe *)(ulong)in_stack_fffffffffffffff0);
  }
  sqlite3VdbeDelete((Vdbe *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeFinalize(Vdbe *p){
  int rc = SQLITE_OK;
  assert( VDBE_RUN_STATE>VDBE_READY_STATE );
  assert( VDBE_HALT_STATE>VDBE_READY_STATE );
  assert( VDBE_INIT_STATE<VDBE_READY_STATE );
  if( p->eVdbeState>=VDBE_READY_STATE ){
    rc = sqlite3VdbeReset(p);
    assert( (rc & p->db->errMask)==rc );
  }
  sqlite3VdbeDelete(p);
  return rc;
}